

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O1

BoolInt CPU_IsSupported_PageGB(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0;
  puVar1 = (uint *)cpuid(0x80000000);
  if (0x80000000 < *puVar1) {
    lVar2 = cpuid(0x80000001);
    uVar3 = *(uint *)(lVar2 + 8) >> 0x1a & 1;
  }
  return uVar3;
}

Assistant:

BoolInt CPU_IsSupported_PageGB(void)
{
  CHECK_CPUID_IS_SUPPORTED
  {
    UInt32 d[4];
    z7_x86_cpuid(d, 0x80000000);
    if (d[0] < 0x80000001)
      return False;
    z7_x86_cpuid(d, 0x80000001);
    return (BoolInt)(d[3] >> 26) & 1;
  }
}